

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O0

void __thiscall Sparse_matrix_Apply_to_vector(void *this,double *vector,double *newVector)

{
  uint local_28;
  uint local_24;
  uint ind;
  uint i;
  double *newVector_local;
  double *vector_local;
  Sparse_matrix *this_local;
  
  for (local_24 = 0; local_24 < *this; local_24 = local_24 + 1) {
    newVector[local_24] =
         *(double *)(*(long *)((long)this + 0x10) + (ulong)local_24 * 8) * vector[local_24];
    for (local_28 = *(uint *)(*(long *)((long)this + 8) + (ulong)local_24 * 4);
        local_28 < *(uint *)(*(long *)((long)this + 8) + (ulong)(local_24 + 1) * 4);
        local_28 = local_28 + 1) {
      newVector[local_24] =
           *(double *)(*(long *)((long)this + 0x10) + (ulong)local_28 * 8) *
           vector[*(uint *)(*(long *)((long)this + 8) + (ulong)local_28 * 4)] + newVector[local_24];
    }
  }
  return;
}

Assistant:

void Sparse_matrix_Apply_to_vector (
    Sparse_matrix const * this,
    double const * vector,
    double * newVector) {

  register unsigned i, ind;
  
  for (i = 0; i < this->size; ++i) {
    newVector[i] = this->elements[i] * vector[i];
    for (ind = this->indices[i]; ind < this->indices[i+1]; ++ind) {
      newVector[i] += this->elements[ind] * vector[this->indices[ind]];
    }
  }
}